

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llnl_cv1_tsd.c
# Opt level: O1

void * inc_count(void *t)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  uint uVar4;
  ulong uVar5;
  
  iVar1 = *t;
  uVar5 = 0;
  do {
    pthread_mutex_lock((pthread_mutex_t *)(*(long *)((long)t + 8) + 8));
    piVar3 = *(int **)((long)t + 8);
    iVar2 = *piVar3;
    *piVar3 = iVar2 + 1;
    if (iVar2 + 1 == 0xc) {
      pthread_cond_signal((pthread_cond_t *)(piVar3 + 0xc));
      printf("inc_count(): thread %ld, count = %d  Threshold reached.\n",(long)iVar1,
             (ulong)**(uint **)((long)t + 8));
    }
    printf("inc_count(): thread %ld, count = %d, i = %d, unlocking mutex\n",(long)iVar1,
           (ulong)**(uint **)((long)t + 8),uVar5);
    pthread_mutex_unlock((pthread_mutex_t *)(*(long *)((long)t + 8) + 8));
    sleep(1);
    uVar4 = (int)uVar5 + 1;
    uVar5 = (ulong)uVar4;
  } while (uVar4 != 10);
  pthread_exit((void *)0x0);
}

Assistant:

void *inc_count(void *t)
{
    tsd_t* tsd = (tsd_t*) t;
    long my_id = tsd->my_id;
    int i;

    for (i=0; i<TCOUNT; i++)
    {
        pthread_mutex_lock(&tsd->common->count_mutex);
        tsd->common->count++;

        /*
        Check the value of count and signal waiting thread when condition is
        reached.  Note that this occurs while mutex is locked.
        */
        if (tsd->common->count == COUNT_LIMIT)
        {
            pthread_cond_signal(&tsd->common->count_threshold_cv);
            printf("inc_count(): thread %ld, count = %d  Threshold reached.\n",
                   my_id, tsd->common->count);
        }
        printf("inc_count(): thread %ld, count = %d, i = %d, unlocking mutex\n",
               my_id, tsd->common->count, i);
        pthread_mutex_unlock(&tsd->common->count_mutex);

        /* Do some "work" so threads can alternate on mutex lock */
        sleep(1);
    }
    pthread_exit(NULL);
}